

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

void sysbvm_methodDictionary_increaseCapacity(sysbvm_context_t *context,sysbvm_tuple_t dictionary)

{
  long lVar1;
  size_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t value;
  sysbvm_tuple_t key;
  size_t i_1;
  size_t i;
  sysbvm_array_t *newStorage;
  size_t newCapacity;
  size_t oldCapacity;
  sysbvm_array_t *oldStorage;
  sysbvm_dictionary_t *dictionaryObject;
  sysbvm_tuple_t dictionary_local;
  sysbvm_context_t *context_local;
  
  lVar1 = *(long *)(dictionary + 0x18);
  sVar2 = sysbvm_tuple_getSizeInSlots(*(sysbvm_tuple_t *)(dictionary + 0x18));
  newStorage = (sysbvm_array_t *)((sVar2 >> 1) << 1);
  if (newStorage < (sysbvm_array_t *)0x8) {
    newStorage = (sysbvm_array_t *)0x8;
  }
  sVar3 = sysbvm_array_create(context,(long)newStorage << 1);
  *(sysbvm_tuple_t *)(dictionary + 0x18) = sVar3;
  for (i_1 = 0; i_1 < newStorage; i_1 = i_1 + 1) {
    *(undefined8 *)(sVar3 + 0x10 + i_1 * 0x10) = 0x3f;
  }
  for (key = 0; key < sVar2 >> 1; key = key + 1) {
    sVar3 = *(sysbvm_tuple_t *)(lVar1 + 0x10 + key * 0x10);
    if (sVar3 != 0x3f) {
      sysbvm_methodDictionary_insertNoCheck
                (dictionary,sVar3,*(sysbvm_tuple_t *)(lVar1 + 0x18 + key * 0x10));
    }
  }
  return;
}

Assistant:

static void sysbvm_methodDictionary_increaseCapacity(sysbvm_context_t *context, sysbvm_tuple_t dictionary)
{
    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *oldStorage = (sysbvm_array_t*)dictionaryObject->storage;

    size_t oldCapacity = sysbvm_tuple_getSizeInSlots(dictionaryObject->storage) / 2;
    size_t newCapacity = oldCapacity * 2;
    if(newCapacity < 8)
        newCapacity = 8;

    // Make the new storage.
    sysbvm_array_t *newStorage = (sysbvm_array_t*)sysbvm_array_create(context, newCapacity*2);
    dictionaryObject->storage = (sysbvm_tuple_t)newStorage;
    for(size_t i = 0; i < newCapacity; ++i)
        newStorage->elements[i*2] = SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE;

    // Reinsert the old elements.
    for(size_t i = 0; i < oldCapacity; ++i)
    {
        sysbvm_tuple_t key = oldStorage->elements[i*2];
        sysbvm_tuple_t value = oldStorage->elements[i*2 + 1];
        if(key != SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
            sysbvm_methodDictionary_insertNoCheck(dictionary, key, value);
    }
}